

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImU32 col,ImGuiDir dir,float scale)

{
  uint in_EDX;
  ImDrawChannel *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float in_XMM1_Da;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 center;
  float r;
  float h;
  ImVec2 *in_stack_fffffffffffffed8;
  ImVec2 *lhs;
  ImU32 col_00;
  ImVec2 *in_stack_fffffffffffffee8;
  ImVec2 *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  ImDrawList *in_stack_ffffffffffffff00;
  undefined1 local_b0 [24];
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_34;
  ImVec2 local_2c;
  float local_24;
  float local_20;
  uint local_18;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  
  local_8 = vmovlpd_avx(in_ZMM0._0_16_);
  local_20 = *(float *)(in_RDI[1]._IdxBuffer.Data + 8);
  local_24 = local_20 * 0.4 * in_XMM1_Da;
  local_18 = in_EDX;
  local_10 = in_RDI;
  ImVec2::ImVec2(&local_34,local_20 * 0.5,local_20 * 0.5 * in_XMM1_Da);
  auVar1._0_8_ = ::operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x458a0a);
  auVar1._8_56_ = extraout_var;
  local_2c = (ImVec2)vmovlpd_avx(auVar1._0_16_);
  ImVec2::ImVec2(&local_40);
  ImVec2::ImVec2(&local_48);
  ImVec2::ImVec2(&local_50);
  if (local_18 != 0xffffffff) {
    if (local_18 < 2) {
      if (local_18 == 0) {
        local_24 = -local_24;
      }
      in_stack_fffffffffffffee8 = &local_90;
      ImVec2::ImVec2(in_stack_fffffffffffffee8,0.75,0.0);
      auVar5._0_8_ = ::operator*(in_stack_fffffffffffffed8,0.0);
      auVar5._8_56_ = extraout_var_03;
      local_88 = (ImVec2)vmovlpd_avx(auVar5._0_16_);
      in_stack_fffffffffffffef0 = (ImVec2 *)(local_b0 + 0x10);
      in_stack_fffffffffffffefc = -0.75;
      local_40 = local_88;
      ImVec2::ImVec2(in_stack_fffffffffffffef0,-0.75,0.866);
      auVar6._0_8_ = ::operator*(in_stack_fffffffffffffed8,0.0);
      auVar6._8_56_ = extraout_var_04;
      local_98 = (ImVec2)vmovlpd_avx(auVar6._0_16_);
      in_stack_ffffffffffffff00 = (ImDrawList *)local_b0;
      local_48 = local_98;
      ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,-0.866);
      auVar7._0_8_ = ::operator*(in_stack_fffffffffffffed8,0.0);
      auVar7._8_56_ = extraout_var_05;
      local_b0._8_8_ = vmovlpd_avx(auVar7._0_16_);
      local_50 = (ImVec2)local_b0._8_8_;
    }
    else if (local_18 - 2 < 2) {
      if (local_18 == 2) {
        local_24 = -local_24;
      }
      ImVec2::ImVec2(&local_60,0.0,0.75);
      auVar2._0_8_ = ::operator*(in_stack_fffffffffffffed8,0.0);
      auVar2._8_56_ = extraout_var_00;
      local_58 = (ImVec2)vmovlpd_avx(auVar2._0_16_);
      local_40 = local_58;
      ImVec2::ImVec2(&local_70,-0.866,-0.75);
      auVar3._0_8_ = ::operator*(in_stack_fffffffffffffed8,0.0);
      auVar3._8_56_ = extraout_var_01;
      local_68 = (ImVec2)vmovlpd_avx(auVar3._0_16_);
      local_48 = local_68;
      ImVec2::ImVec2(&local_80,0.866,-0.75);
      auVar4._0_8_ = ::operator*(in_stack_fffffffffffffed8,0.0);
      auVar4._8_56_ = extraout_var_02;
      local_78 = (ImVec2)vmovlpd_avx(auVar4._0_16_);
      local_50 = local_78;
    }
  }
  lhs = &local_2c;
  col_00 = local_10._4_4_;
  auVar8._0_8_ = ::operator+(lhs,(ImVec2 *)0x458cd5);
  auVar8._8_56_ = extraout_var_06;
  vmovlpd_avx(auVar8._0_16_);
  auVar9._0_8_ = ::operator+(lhs,(ImVec2 *)0x458cec);
  auVar9._8_56_ = extraout_var_07;
  vmovlpd_avx(auVar9._0_16_);
  auVar10._0_8_ = ::operator+(lhs,(ImVec2 *)0x458d03);
  auVar10._8_56_ = extraout_var_08;
  vmovlpd_avx(auVar10._0_16_);
  ImDrawList::AddTriangleFilled
            (in_stack_ffffffffffffff00,
             (ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,col_00);
  return;
}

Assistant:

void ImGui::RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImU32 col, ImGuiDir dir, float scale)
{
    const float h = draw_list->_Data->FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = pos + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f, +0.750f) * r;
        b = ImVec2(-0.866f, -0.750f) * r;
        c = ImVec2(+0.866f, -0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f, +0.000f) * r;
        b = ImVec2(-0.750f, +0.866f) * r;
        c = ImVec2(-0.750f, -0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }
    draw_list->AddTriangleFilled(center + a, center + b, center + c, col);
}